

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions_1_2.cpp
# Opt level: O0

void __thiscall QOpenGLFunctions_1_2::~QOpenGLFunctions_1_2(QOpenGLFunctions_1_2 *this)

{
  undefined8 *in_RDI;
  QAbstractOpenGLFunctions *unaff_retaddr;
  
  *in_RDI = &PTR__QOpenGLFunctions_1_2_00214850;
  if (in_RDI[2] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1b880e);
  }
  if (in_RDI[3] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1b882c);
  }
  if (in_RDI[4] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1b884a);
  }
  if (in_RDI[5] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1b8868);
  }
  if (in_RDI[6] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1b8886);
  }
  if (in_RDI[7] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1b88a4);
  }
  QAbstractOpenGLFunctions::~QAbstractOpenGLFunctions(unaff_retaddr);
  return;
}

Assistant:

QOpenGLFunctions_1_2::~QOpenGLFunctions_1_2()
{
    if (d_1_0_Core) {
        d_1_0_Core->refs.deref();
        Q_ASSERT(d_1_0_Core->refs.loadRelaxed());
    }
    if (d_1_1_Core) {
        d_1_1_Core->refs.deref();
        Q_ASSERT(d_1_1_Core->refs.loadRelaxed());
    }
    if (d_1_2_Core) {
        d_1_2_Core->refs.deref();
        Q_ASSERT(d_1_2_Core->refs.loadRelaxed());
    }
    if (d_1_0_Deprecated) {
        d_1_0_Deprecated->refs.deref();
        Q_ASSERT(d_1_0_Deprecated->refs.loadRelaxed());
    }
    if (d_1_1_Deprecated) {
        d_1_1_Deprecated->refs.deref();
        Q_ASSERT(d_1_1_Deprecated->refs.loadRelaxed());
    }
    if (d_1_2_Deprecated) {
        d_1_2_Deprecated->refs.deref();
        Q_ASSERT(d_1_2_Deprecated->refs.loadRelaxed());
    }
}